

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsatSolver.c
# Opt level: O3

void xSAT_SolverGarbageCollect(xSAT_Solver_t *s)

{
  xSAT_VecWatchList_t *pxVar1;
  int *piVar2;
  xSAT_Mem_t *__ptr;
  xSAT_Mem_t *pDest;
  uint *puVar3;
  Vec_Int_t *pVVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  xSAT_Watcher_t *pxVar9;
  
  uVar6 = s->pMemory->nCap - s->pMemory->nWasted;
  pDest = (xSAT_Mem_t *)calloc(1,0x18);
  uVar5 = 0x100000;
  if (0 < (int)uVar6) {
    uVar5 = uVar6;
  }
  uVar6 = 0;
  do {
    uVar6 = uVar6 + ((uVar6 >> 3) + (uVar6 >> 1) & 0xfffffffe) + 2;
  } while (uVar6 < uVar5);
  pDest->nCap = uVar6;
  puVar3 = (uint *)malloc((ulong)uVar6 << 2);
  pDest->pData = puVar3;
  if (0 < s->vAssigns->nSize) {
    lVar8 = 0;
    do {
      pxVar1 = s->vWatches;
      if (pxVar1->nCap <= lVar8) {
LAB_008f4649:
        __assert_fail("iEntry < v->nCap",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/xsat/xsatWatchList.h"
                      ,0x106,"xSAT_WatchList_t *xSAT_VecWatchListEntry(xSAT_VecWatchList_t *, int)")
        ;
      }
      if (pxVar1->nSize <= lVar8) {
LAB_008f462a:
        __assert_fail("iEntry < v->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/xsat/xsatWatchList.h"
                      ,0x107,"xSAT_WatchList_t *xSAT_VecWatchListEntry(xSAT_VecWatchList_t *, int)")
        ;
      }
      lVar7 = (long)pxVar1->pArray[lVar8].nSize;
      if (lVar7 != 0) {
        pxVar9 = pxVar1->pArray[lVar8].pArray;
        lVar7 = lVar7 << 3;
        do {
          xSAT_SolverClaRealloc(pDest,s->pMemory,&pxVar9->CRef);
          pxVar9 = pxVar9 + 1;
          lVar7 = lVar7 + -8;
        } while (lVar7 != 0);
      }
      pxVar1 = s->vBinWatches;
      if (pxVar1->nCap <= lVar8) goto LAB_008f4649;
      if (pxVar1->nSize <= lVar8) goto LAB_008f462a;
      lVar7 = (long)pxVar1->pArray[lVar8].nSize;
      if (lVar7 != 0) {
        pxVar9 = pxVar1->pArray[lVar8].pArray;
        lVar7 = lVar7 << 3;
        do {
          xSAT_SolverClaRealloc(pDest,s->pMemory,&pxVar9->CRef);
          pxVar9 = pxVar9 + 1;
          lVar7 = lVar7 + -8;
        } while (lVar7 != 0);
      }
      lVar8 = lVar8 + 1;
      lVar7 = (long)s->vAssigns->nSize;
    } while (SBORROW8(lVar8,lVar7 * 2) != lVar8 + lVar7 * -2 < 0);
  }
  pVVar4 = s->vTrail;
  if (0 < pVVar4->nSize) {
    lVar8 = 0;
    do {
      uVar5 = pVVar4->pArray[lVar8] >> 1;
      if (((int)uVar5 < 0) || (s->vReasons->nSize <= (int)uVar5)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      piVar2 = s->vReasons->pArray;
      if (piVar2[uVar5] != -1) {
        xSAT_SolverClaRealloc(pDest,s->pMemory,(uint *)(piVar2 + uVar5));
        pVVar4 = s->vTrail;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < pVVar4->nSize);
  }
  if (0 < s->vLearnts->nSize) {
    puVar3 = (uint *)s->vLearnts->pArray;
    lVar8 = 0;
    do {
      xSAT_SolverClaRealloc(pDest,s->pMemory,puVar3);
      lVar8 = lVar8 + 1;
      puVar3 = puVar3 + 1;
    } while (lVar8 < s->vLearnts->nSize);
  }
  if (0 < s->vClauses->nSize) {
    puVar3 = (uint *)s->vClauses->pArray;
    lVar8 = 0;
    do {
      xSAT_SolverClaRealloc(pDest,s->pMemory,puVar3);
      lVar8 = lVar8 + 1;
      puVar3 = puVar3 + 1;
    } while (lVar8 < s->vClauses->nSize);
  }
  __ptr = s->pMemory;
  puVar3 = __ptr->pData;
  if (puVar3 != (uint *)0x0) {
    free(puVar3);
  }
  free(__ptr);
  s->pMemory = pDest;
  return;
}

Assistant:

void xSAT_SolverGarbageCollect( xSAT_Solver_t * s )
{
    int i;
    unsigned * pArray;
    xSAT_Mem_t * pNewMemMngr = xSAT_MemAlloc(  xSAT_MemCap( s->pMemory ) - xSAT_MemWastedCap( s->pMemory ) );

    for ( i = 0; i < 2 * Vec_StrSize( s->vAssigns ); i++ )
    {
        xSAT_WatchList_t* ws = xSAT_VecWatchListEntry( s->vWatches, i);
        xSAT_Watcher_t* begin = xSAT_WatchListArray(ws);
        xSAT_Watcher_t* end   = begin + xSAT_WatchListSize(ws);
        xSAT_Watcher_t *w;

        for ( w = begin; w != end; w++ )
            xSAT_SolverClaRealloc( pNewMemMngr, s->pMemory, &(w->CRef) );

        ws = xSAT_VecWatchListEntry( s->vBinWatches, i);
        begin = xSAT_WatchListArray(ws);
        end   = begin + xSAT_WatchListSize(ws);
        for ( w = begin; w != end; w++ )
            xSAT_SolverClaRealloc( pNewMemMngr, s->pMemory, &(w->CRef) );
    }

    for ( i = 0; i < Vec_IntSize( s->vTrail ); i++ )
        if ( ( unsigned ) Vec_IntEntry( s->vReasons, xSAT_Lit2Var( Vec_IntEntry( s->vTrail, i ) ) ) != CRefUndef )
            xSAT_SolverClaRealloc( pNewMemMngr, s->pMemory, ( unsigned * ) &( Vec_IntArray( s->vReasons )[xSAT_Lit2Var( Vec_IntEntry( s->vTrail, i ) )] ) );

    pArray = ( unsigned * ) Vec_IntArray( s->vLearnts );
    for ( i = 0; i < Vec_IntSize( s->vLearnts ); i++ )
        xSAT_SolverClaRealloc( pNewMemMngr, s->pMemory, &(pArray[i]) );

    pArray = ( unsigned * ) Vec_IntArray( s->vClauses );
    for ( i = 0; i < Vec_IntSize( s->vClauses ); i++ )
        xSAT_SolverClaRealloc( pNewMemMngr, s->pMemory, &(pArray[i]) );

    xSAT_MemFree( s->pMemory );
    s->pMemory = pNewMemMngr;
}